

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::basic_format_specs<char>::basic_format_specs(basic_format_specs<char> *this)

{
  fill_t<char> fVar1;
  basic_format_specs<char> *this_local;
  
  this->width = 0;
  this->precision = -1;
  this->type = '\0';
  this->field_0x9 = this->field_0x9 & 0xf0;
  this->field_0x9 = this->field_0x9 & 0x8f;
  this->field_0x9 = this->field_0x9 & 0x7f;
  fVar1 = detail::fill_t<char>::make();
  *&(this->fill).data_ = fVar1.data_;
  (this->fill).size_ = fVar1.size_;
  return;
}

Assistant:

constexpr basic_format_specs()
      : width(0),
        precision(-1),
        type(0),
        align(align::none),
        sign(sign::none),
        alt(false),
        fill(detail::fill_t<Char>::make()) {}